

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupCommandLineTestRunner::TEST_GROUP_CppUTestGroupCommandLineTestRunner
          (TEST_GROUP_CppUTestGroupCommandLineTestRunner *this)

{
  TEST_GROUP_CppUTestGroupCommandLineTestRunner *this_local;
  
  Utest::Utest(&this->super_Utest);
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupCommandLineTestRunner_003ced50;
  TestRegistry::TestRegistry(&this->registry);
  return;
}

Assistant:

TEST_GROUP(CommandLineTestRunner)
{
    TestRegistry registry;
    UtestShell *test1;
    UtestShell *test2;
    DummyPluginWhichCountsThePlugins* pluginCountingPlugin;

    void setup() _override
    {
      test1 = new UtestShell("group1", "test1", "file1", 1);
      test2 = new UtestShell("group2", "test2", "file2", 2);
      registry.addTest(test1);
      pluginCountingPlugin = new DummyPluginWhichCountsThePlugins("PluginCountingPlugin", &registry);
    }
    void teardown() _override
    {
      delete pluginCountingPlugin;
      delete test2;
      delete test1;
    }

    SimpleString runAndGetOutput(const int argc, const char* argv[])
    {
        CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(argc, argv, &registry);
        commandLineTestRunner.runAllTestsMain();
        return commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer->getOutput();
    }
}